

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ovf.cpp
# Opt level: O1

int ovf_close(ovf_file *ovf_file_ptr)

{
  parser_state *this;
  pointer pcVar1;
  int iVar2;
  
  iVar2 = -2;
  if ((ovf_file_ptr != (ovf_file *)0x0) &&
     (this = ovf_file_ptr->_state, iVar2 = -2, this != (parser_state *)0x0)) {
    pcVar1 = (this->message_latest)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(this->message_latest).field_2) {
      operator_delete(pcVar1);
    }
    pcVar1 = (this->message_out)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(this->message_out).field_2) {
      operator_delete(pcVar1);
    }
    pcVar1 = (this->value)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(this->value).field_2) {
      operator_delete(pcVar1);
    }
    pcVar1 = (this->keyword)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(this->keyword).field_2) {
      operator_delete(pcVar1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&this->file_contents);
    operator_delete(this);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int ovf_close(struct ovf_file * ovf_file_ptr)
try
{
    if( !ovf_file_ptr )
        return OVF_ERROR;
    if( !ovf_file_ptr->_state )
        return OVF_ERROR;
    delete(ovf_file_ptr->_state);
    return OVF_OK;
}
catch( ... )
{
    return OVF_ERROR;
}